

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O1

REF_STATUS ref_layer_align_quad(REF_GRID ref_grid)

{
  REF_MIGRATE_PARTIONER RVar1;
  int iVar2;
  REF_NODE ref_node;
  REF_ADJ pRVar3;
  REF_ADJ_ITEM pRVar4;
  REF_DBL *pRVar5;
  REF_CLOUD ref_cloud;
  uint uVar6;
  long lVar7;
  undefined8 uVar8;
  REF_CELL pRVar9;
  ulong uVar10;
  REF_INT RVar11;
  long lVar12;
  bool bVar13;
  double dVar14;
  REF_INT new_node;
  REF_INT id;
  REF_DBL normal [3];
  REF_LIST previous_list;
  REF_CLOUD previous_cloud;
  REF_DBL xyz [3];
  REF_GLOB global;
  REF_INT closest_node;
  REF_DBL uv [2];
  REF_CLOUD next_cloud;
  REF_LIST next_list;
  REF_DBL dist;
  uint local_17c;
  int local_168;
  REF_INT local_164;
  REF_CAVITY local_160;
  REF_DBL local_158;
  double dStack_150;
  double local_148;
  REF_GEOM local_138;
  REF_LIST local_130;
  REF_CLOUD local_128;
  undefined4 local_11c;
  REF_DBL local_118;
  REF_DBL local_110;
  REF_DBL local_108;
  REF_GLOB local_100;
  REF_LIST local_f8;
  REF_CLOUD local_f0;
  REF_CELL local_e8;
  REF_INT local_dc;
  REF_DBL local_d8 [2];
  REF_CLOUD local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  REF_LIST local_68 [6];
  REF_DBL local_38;
  
  RVar1 = ref_grid->partitioner;
  ref_grid->partitioner = REF_MIGRATE_SINGLE;
  uVar6 = ref_migrate_to_balance(ref_grid);
  if (uVar6 == 0) {
    uVar6 = ref_cloud_create(&local_128,3);
    if (uVar6 == 0) {
      uVar6 = ref_list_create(&local_130);
      if (uVar6 == 0) {
        ref_node = ref_grid->node;
        local_11c = 0;
        if (0 < ref_node->max) {
          local_f0 = local_128;
          local_f8 = local_130;
          local_138 = ref_grid->geom;
          pRVar9 = ref_grid->cell[0];
          lVar12 = 0;
          local_e8 = pRVar9;
          do {
            if (((-1 < ref_node->global[lVar12]) && (lVar12 < pRVar9->ref_adj->nnode)) &&
               (pRVar9->ref_adj->first[lVar12] != -1)) {
              pRVar9 = ref_grid->cell[0];
              local_158 = 0.0;
              dStack_150 = 0.0;
              local_148 = 0.0;
              pRVar3 = pRVar9->ref_adj;
              uVar10 = 0xffffffff;
              if (lVar12 < pRVar3->nnode) {
                uVar10 = (ulong)(uint)pRVar3->first[lVar12];
              }
              if ((int)uVar10 != -1) {
                RVar11 = pRVar3->item[(int)uVar10].ref;
                do {
                  uVar6 = ref_layer_interior_seg_normal(ref_grid,RVar11,(REF_DBL *)&local_c8);
                  if (uVar6 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x20f,"ref_layer_twod_normal",(ulong)uVar6,"normal");
                    uVar10 = (ulong)uVar6;
                    goto LAB_00204763;
                  }
                  local_158 = (double)local_c8 + local_158;
                  dStack_150 = local_c0 + dStack_150;
                  local_148 = local_b8 + local_148;
                  pRVar4 = pRVar9->ref_adj->item;
                  iVar2 = pRVar4[(int)uVar10].next;
                  uVar10 = (ulong)iVar2;
                  if (uVar10 == 0xffffffffffffffff) {
                    RVar11 = -1;
                  }
                  else {
                    RVar11 = pRVar4[uVar10].ref;
                  }
                } while (iVar2 != -1);
              }
              uVar6 = ref_math_normalize(&local_158);
              if (uVar6 == 0) {
                uVar10 = 0;
              }
              else {
                uVar10 = (ulong)uVar6;
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x214,"ref_layer_twod_normal",(ulong)uVar6,"norm");
              }
LAB_00204763:
              if ((uint)uVar10 == 0) {
                RVar11 = (REF_INT)lVar12;
                uVar6 = ref_node_metric_get(ref_node,RVar11,(REF_DBL *)local_68);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x227,"ref_layer_align_first_layer",(ulong)uVar6,"get");
                  local_17c = uVar6;
                  goto LAB_00204887;
                }
                uVar6 = ref_matrix_diag_m((REF_DBL *)local_68,(REF_DBL *)&local_c8);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x228,"ref_layer_align_first_layer",(ulong)uVar6,"eigen decomp");
                  local_17c = uVar6;
                  goto LAB_00204887;
                }
                uVar6 = ref_matrix_descending_eig_twod((REF_DBL *)&local_c8);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x229,"ref_layer_align_first_layer",(ulong)uVar6,"2D eig sort");
                  local_17c = uVar6;
                  goto LAB_00204887;
                }
                dVar14 = local_148 * local_a0 + local_158 * local_b0 + dStack_150 * local_a8;
                if (dVar14 <= -dVar14) {
                  dVar14 = -dVar14;
                }
                bVar13 = true;
                if (0.9848 < dVar14) {
                  if ((double)local_c8 < 0.0) {
                    dVar14 = sqrt((double)local_c8);
                  }
                  else {
                    dVar14 = SQRT((double)local_c8);
                  }
                  dVar14 = 1.0 / dVar14;
                  pRVar5 = ref_node->real;
                  local_118 = local_158 * dVar14 + pRVar5[lVar12 * 0xf];
                  local_110 = dStack_150 * dVar14 + pRVar5[lVar12 * 0xf + 1];
                  local_108 = dVar14 * local_148 + pRVar5[lVar12 * 0xf + 2];
                  uVar6 = ref_node_nearest_xyz(ref_node,&local_118,&local_dc,&local_38);
                  if (uVar6 == 0) {
                    uVar6 = ref_node_next_global(ref_node,&local_100);
                    if (uVar6 == 0) {
                      uVar6 = ref_cloud_push(local_f0,local_100,&local_158);
                      if (uVar6 == 0) {
                        uVar6 = ref_list_push(local_f8,RVar11);
                        if (uVar6 == 0) {
                          uVar6 = ref_node_add(ref_node,local_100,&local_168);
                          if (uVar6 == 0) {
                            pRVar5 = ref_node->real;
                            lVar7 = (long)local_168;
                            pRVar5[lVar7 * 0xf] = local_118;
                            pRVar5[lVar7 * 0xf + 1] = local_110;
                            pRVar5[lVar7 * 0xf + 2] = local_108;
                            uVar6 = ref_geom_unique_id(local_138,RVar11,2,&local_164);
                            if (uVar6 == 0) {
                              uVar6 = ref_geom_tuv(local_138,RVar11,2,local_164,local_d8);
                              if (uVar6 == 0) {
                                uVar6 = ref_egads_inverse_eval
                                                  (local_138,2,local_164,&local_118,local_d8);
                                if (uVar6 == 0) {
                                  uVar6 = ref_geom_add(local_138,local_168,2,local_164,local_d8);
                                  if (uVar6 == 0) {
                                    uVar6 = ref_metric_interpolate_between
                                                      (ref_grid,RVar11,-1,local_168);
                                    if (uVar6 == 0) {
                                      uVar6 = ref_cavity_create(&local_160);
                                      if (uVar6 == 0) {
                                        uVar6 = ref_cavity_form_insert
                                                          (local_160,ref_grid,local_168,RVar11,-1,-1
                                                          );
                                        if (uVar6 == 0) {
                                          uVar6 = ref_cavity_enlarge_conforming(local_160);
                                          if (uVar6 == 0) {
                                            uVar6 = ref_cavity_replace(local_160);
                                            if (uVar6 == 0) {
                                              uVar6 = ref_cavity_free(local_160);
                                              bVar13 = uVar6 == 0;
                                              if (!bVar13) {
                                                bVar13 = false;
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                                  ,0x255,"ref_layer_align_first_layer",(ulong)uVar6,
                                                  "cav free");
                                                local_17c = uVar6;
                                              }
                                              goto LAB_00204889;
                                            }
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                                  ,0x254,"ref_layer_align_first_layer",(ulong)uVar6,
                                                  "cav replace");
                                            ref_cavity_tec(local_160,
                                                           "ref_layer_align_quad_cavity.tec");
                                            ref_export_by_extension
                                                      (ref_grid,"ref_layer_align_quad_mesh.tec");
                                            printf("norm %f %f %f dir %f %f %f dot %f\n");
                                            printf("new %f %f %f\n",local_118,local_110,local_108);
                                            local_17c = uVar6;
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                                  ,0x24d,"ref_layer_align_first_layer",(ulong)uVar6,
                                                  "enlarge");
                                            ref_cavity_tec(local_160,"cav-fail.tec");
                                            ref_export_by_extension(ref_grid,"mesh-fail.tec");
                                            local_17c = uVar6;
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                                 ,0x249,"ref_layer_align_first_layer",(ulong)uVar6,
                                                 "ball");
                                          local_17c = uVar6;
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                               ,0x246,"ref_layer_align_first_layer",(ulong)uVar6,
                                               "cav create");
                                        local_17c = uVar6;
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                             ,0x245,"ref_layer_align_first_layer",(ulong)uVar6,
                                             "metric interp");
                                      local_17c = uVar6;
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                           ,0x243,"ref_layer_align_first_layer",(ulong)uVar6,
                                           "new geom");
                                    local_17c = uVar6;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                         ,0x242,"ref_layer_align_first_layer",(ulong)uVar6,
                                         "inverse uv");
                                  local_17c = uVar6;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                       ,0x241,"ref_layer_align_first_layer",(ulong)uVar6,"uv");
                                local_17c = uVar6;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x240,"ref_layer_align_first_layer",(ulong)uVar6,
                                     "unique face id");
                              local_17c = uVar6;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x23b,"ref_layer_align_first_layer",(ulong)uVar6,"add");
                            local_17c = uVar6;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x23a,"ref_layer_align_first_layer",(ulong)uVar6,"store list");
                          local_17c = uVar6;
                        }
                        bVar13 = false;
                        goto LAB_00204889;
                      }
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0x239,"ref_layer_align_first_layer",(ulong)uVar6,"store cloud");
                      local_17c = uVar6;
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0x238,"ref_layer_align_first_layer",(ulong)uVar6,"global");
                      local_17c = uVar6;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x237,"ref_layer_align_first_layer",(ulong)uVar6,"close");
                    local_17c = uVar6;
                  }
                  goto LAB_00204887;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x226,"ref_layer_align_first_layer",uVar10,"twod normal");
                local_17c = (uint)uVar10;
LAB_00204887:
                bVar13 = false;
              }
LAB_00204889:
              pRVar9 = local_e8;
              if (!bVar13) goto LAB_00204f62;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < ref_node->max);
        }
        local_17c = 0;
LAB_00204f62:
        if (local_17c == 0) {
          local_17c = ref_layer_quad_right_triangles(ref_grid);
          if (local_17c == 0) {
            local_17c = ref_cloud_create(&local_c8,3);
            if (local_17c == 0) {
              local_17c = ref_list_create(local_68);
              if (local_17c == 0) {
                local_17c = ref_layer_align_quad_advance
                                      (ref_grid,local_128,local_130,local_c8,local_68[0]);
                if (local_17c == 0) {
                  local_17c = ref_cloud_free(local_128);
                  if (local_17c == 0) {
                    local_17c = ref_list_free(local_130);
                    ref_cloud = local_c8;
                    if (local_17c == 0) {
                      local_128 = local_c8;
                      local_130 = local_68[0];
                      local_c8 = (REF_CLOUD)0x0;
                      local_68[0] = (REF_LIST)0x0;
                      local_17c = ref_cloud_free(ref_cloud);
                      if (local_17c == 0) {
                        local_17c = ref_layer_quad_right_triangles(ref_grid);
                        if (local_17c == 0) {
                          local_17c = 0;
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x2c5,"ref_layer_align_quad_seq",(ulong)local_17c,"tri2qaud");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x2c3,"ref_layer_align_quad_seq",(ulong)local_17c,"free next cloud")
                        ;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,700,"ref_layer_align_quad_seq",(ulong)local_17c,"free previous list");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,699,"ref_layer_align_quad_seq",(ulong)local_17c,"free previous cloud");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x2ba,"ref_layer_align_quad_seq",(ulong)local_17c,"first layer");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x2b7,"ref_layer_align_quad_seq",(ulong)local_17c,"next list");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x2b6,"ref_layer_align_quad_seq",(ulong)local_17c,"next cloud");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x2b5,"ref_layer_align_quad_seq",(ulong)local_17c,"tri2qaud");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x2b3,"ref_layer_align_quad_seq",(ulong)local_17c,"first layer");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x2b0,"ref_layer_align_quad_seq",(ulong)uVar6,"previous list");
        local_17c = uVar6;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x2af
             ,"ref_layer_align_quad_seq",(ulong)uVar6,"previous cloud");
      local_17c = uVar6;
    }
    if (local_17c != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x2cf
             ,"ref_layer_align_quad",(ulong)local_17c,"quad");
      return local_17c;
    }
    ref_grid->partitioner = RVar1;
    uVar6 = ref_migrate_to_balance(ref_grid);
    if (uVar6 == 0) {
      return 0;
    }
    uVar8 = 0x2d1;
  }
  else {
    uVar8 = 0x2ce;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar8,
         "ref_layer_align_quad",(ulong)uVar6,"migrate to single part");
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_layer_align_quad(REF_GRID ref_grid) {
  REF_MIGRATE_PARTIONER previous;
  previous = ref_grid_partitioner(ref_grid);
  ref_grid_partitioner(ref_grid) = REF_MIGRATE_SINGLE;
  RSS(ref_migrate_to_balance(ref_grid), "migrate to single part");
  RSS(ref_layer_align_quad_seq(ref_grid), "quad");
  ref_grid_partitioner(ref_grid) = previous;
  RSS(ref_migrate_to_balance(ref_grid), "migrate to single part");
  return REF_SUCCESS;
}